

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O1

void __thiscall
randomx::SuperscalarInstruction::create
          (SuperscalarInstruction *this,SuperscalarInstructionInfo *info,Blake2Generator *gen)

{
  byte bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  
  this->info_ = info;
  this->src_ = -1;
  this->dst_ = -1;
  this->canReuse_ = false;
  this->groupParIsSource_ = false;
  switch(info->type_) {
  case ISUB_R:
    this->mod_ = 0;
    this->imm32_ = 0;
    this->opGroup_ = IADD_RS;
    break;
  case IXOR_R:
    this->mod_ = 0;
    this->imm32_ = 0;
    this->opGroup_ = IXOR_R;
    break;
  case IADD_RS:
    bVar1 = Blake2Generator::getByte(gen);
    this->mod_ = (uint)bVar1;
    this->imm32_ = 0;
    this->opGroup_ = IADD_RS;
    break;
  case IMUL_R:
    this->mod_ = 0;
    this->imm32_ = 0;
    this->opGroup_ = IMUL_R;
    break;
  case IROR_C:
    this->mod_ = 0;
    do {
      bVar1 = Blake2Generator::getByte(gen);
      this->imm32_ = (uint)(bVar1 & 0x3f);
    } while ((bVar1 & 0x3f) == 0);
    uVar3 = 0xffffffff00000004;
    goto LAB_00115e5d;
  case IADD_C7:
  case IADD_C8:
  case IADD_C9:
    this->mod_ = 0;
    uVar2 = Blake2Generator::getUInt32(gen);
    this->imm32_ = uVar2;
    uVar3 = 0xffffffff00000005;
    goto LAB_00115e5d;
  case IXOR_C7:
  case IXOR_C8:
  case IXOR_C9:
    this->mod_ = 0;
    uVar2 = Blake2Generator::getUInt32(gen);
    this->imm32_ = uVar2;
    uVar3 = 0xffffffff00000006;
    goto LAB_00115e5d;
  case IMULH_R:
    this->canReuse_ = true;
    this->mod_ = 0;
    this->imm32_ = 0;
    this->opGroup_ = IMULH_R;
    goto LAB_00115dd4;
  case ISMULH_R:
    this->canReuse_ = true;
    this->mod_ = 0;
    this->imm32_ = 0;
    this->opGroup_ = ISMULH_R;
LAB_00115dd4:
    uVar2 = Blake2Generator::getUInt32(gen);
    this->opGroupPar_ = uVar2;
    return;
  case IMUL_RCP:
    this->mod_ = 0;
    do {
      uVar2 = Blake2Generator::getUInt32(gen);
      this->imm32_ = uVar2;
    } while ((uVar2 & uVar2 - 1) == 0);
    uVar3 = 0xffffffff0000000d;
LAB_00115e5d:
    this->opGroup_ = (int)uVar3;
    this->opGroupPar_ = (int)((ulong)uVar3 >> 0x20);
  default:
    goto switchD_00115d68_default;
  }
  this->groupParIsSource_ = true;
switchD_00115d68_default:
  return;
}

Assistant:

void create(const SuperscalarInstructionInfo* info, Blake2Generator& gen) {
			info_ = info;
			reset();
			switch (info->getType())
			{
			case SuperscalarInstructionType::ISUB_R: {
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IADD_RS;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IXOR_R: {
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IXOR_R;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IADD_RS: {
				mod_ = gen.getByte();
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IADD_RS;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IMUL_R: {
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IMUL_R;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IROR_C: {
				mod_ = 0;
				do {
					imm32_ = gen.getByte() & 63;
				} while (imm32_ == 0);
				opGroup_ = SuperscalarInstructionType::IROR_C;
				opGroupPar_ = -1;
			} break;

			case SuperscalarInstructionType::IADD_C7:
			case SuperscalarInstructionType::IADD_C8:
			case SuperscalarInstructionType::IADD_C9: {
				mod_ = 0;
				imm32_ = gen.getUInt32();
				opGroup_ = SuperscalarInstructionType::IADD_C7;
				opGroupPar_ = -1;
			} break;

			case SuperscalarInstructionType::IXOR_C7:
			case SuperscalarInstructionType::IXOR_C8:
			case SuperscalarInstructionType::IXOR_C9: {
				mod_ = 0;
				imm32_ = gen.getUInt32();
				opGroup_ = SuperscalarInstructionType::IXOR_C7;
				opGroupPar_ = -1;
			} break;

			case SuperscalarInstructionType::IMULH_R: {
				canReuse_ = true;
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IMULH_R;
				opGroupPar_ = gen.getUInt32();
			} break;

			case SuperscalarInstructionType::ISMULH_R: {
				canReuse_ = true;
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::ISMULH_R;
				opGroupPar_ = gen.getUInt32();
			} break;

			case SuperscalarInstructionType::IMUL_RCP: {
				mod_ = 0;
				do {
					imm32_ = gen.getUInt32();
				} while (isZeroOrPowerOf2(imm32_));
				opGroup_ = SuperscalarInstructionType::IMUL_RCP;
				opGroupPar_ = -1;
			} break;

			default:
				break;
			}
		}